

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O0

TestCaseGroup * vkt::tessellation::createGeometryGridRenderScatterTests(TestContext *testCtx)

{
  char *pcVar1;
  undefined8 testCtx_00;
  TestCaseGroup *pTVar2;
  TestNode *this;
  GridRenderTestCase *this_00;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  int local_34;
  DefaultDeleter<tcu::TestCaseGroup> local_2d;
  int ndx;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"scatter","Scatter output primitives");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_2d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar2
            );
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    this = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
    this_00 = (GridRenderTestCase *)operator_new(0x88);
    testCtx_00 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                 .m_data._8_8_;
    pcVar1 = createGeometryGridRenderScatterTests::cases[local_34].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar1,&local_59);
    pcVar1 = createGeometryGridRenderScatterTests::cases[local_34].desc;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar1,&local_81);
    anon_unknown_1::GridRenderTestCase::GridRenderTestCase
              (this_00,(TestContext *)testCtx_00,&local_58,&local_80,
               createGeometryGridRenderScatterTests::cases[local_34].flags);
    tcu::TestNode::addChild(this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createGeometryGridRenderScatterTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "scatter", "Scatter output primitives"));

	static const TestCaseDescription cases[] =
	{
		{
			"geometry_scatter_instances",
			"Each geometry shader instance outputs its primitives far from other instances of the same execution",
			FLAG_GEOMETRY_SCATTER_INSTANCES
		},
		{
			"geometry_scatter_primitives",
			"Each geometry shader instance outputs its primitives far from other primitives of the same instance",
			FLAG_GEOMETRY_SCATTER_PRIMITIVES | FLAG_GEOMETRY_SEPARATE_PRIMITIVES
		},
		{
			"geometry_scatter_layers",
			"Each geometry shader instance outputs its primitives to multiple layers and far from other primitives of the same instance",
			FLAG_GEOMETRY_SCATTER_LAYERS | FLAG_GEOMETRY_SEPARATE_PRIMITIVES
		},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ++ndx)
		group->addChild(new GridRenderTestCase(testCtx, cases[ndx].name, cases[ndx].desc, cases[ndx].flags));

	return group.release();
}